

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::EvaluateElementPoint
          (ChElementHexaANCF_3843 *this,double xi,double eta,double zeta,ChVector<double> *point)

{
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_490;
  VectorN *local_488;
  VectorN local_480;
  Matrix3xN local_380;
  
  Calc_Sxi_compact(this,&local_480,xi,eta,zeta);
  CalcCoordMatrix(this,&local_380);
  local_490 = &local_380;
  local_488 = &local_480;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>_>
                    *)&local_490);
  return;
}

Assistant:

void ChElementHexaANCF_3843::EvaluateElementPoint(const double xi,
                                                  const double eta,
                                                  const double zeta,
                                                  ChVector<>& point) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;
}